

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall CcsTest_Load_Test::TestBody(CcsTest_Load_Test *this)

{
  bool bVar1;
  string *rhs;
  char *message;
  allocator local_27c;
  allocator local_27b;
  allocator local_27a;
  allocator local_279;
  string local_278;
  string local_258;
  CcsDomain ccs;
  string local_230;
  AssertionResult gtest_ar;
  CcsContext local_1f0;
  CcsContext ctx;
  CcsContext root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  istringstream input;
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  std::__cxx11::string::string
            ((string *)&local_258,"foo.bar > baz.quux: frob = \'nitz\'",(allocator *)&local_278);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&local_258,_S_in);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::string((string *)&local_258,"<literal>",(allocator *)&local_278);
  ::ccs::CcsDomain::loadCcsStream
            (&ccs,(istream *)&input,&local_258,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_258);
  ::ccs::CcsDomain::build((CcsDomain *)&root);
  std::__cxx11::string::string((string *)&local_258,"foo",&local_279);
  std::__cxx11::string::string((string *)&local_278,"bar",&local_27a);
  anon_unknown.dwarf_2c58d::v(&local_1a8,&local_278);
  ::ccs::CcsContext::CcsContext(&local_1f0,&root,&local_258,&local_1a8);
  std::__cxx11::string::string((string *)&gtest_ar,"baz",&local_27b);
  std::__cxx11::string::string((string *)&local_230,"quux",&local_27c);
  anon_unknown.dwarf_2c58d::v(&local_1c0,&local_230);
  ::ccs::CcsContext::CcsContext(&ctx,&local_1f0,(string *)&gtest_ar,&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1f0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258.field_2._M_allocated_capacity = 0;
  local_258.field_2._8_8_ = 0;
  local_258._M_string_length = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_278,"frob",(allocator *)&local_230);
    rhs = ::ccs::CcsContext::getString(&ctx,&local_278);
    testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"nitz\"","ctx.getString(\"frob\")",(char (*) [5])"nitz",rhs);
    std::__cxx11::string::~string((string *)&local_278);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_278);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
                 ,0x19,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
      if ((long *)local_278._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_278._M_dataplus._M_p + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  std::__cxx11::string::~string((string *)&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(CcsTest, Load) {
  CcsDomain ccs;
  std::istringstream input("foo.bar > baz.quux: frob = 'nitz'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("foo", v("bar")).constrain("baz", v("quux"));
  ASSERT_NO_THROW(EXPECT_EQ("nitz", ctx.getString("frob")));
}